

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

bool __thiscall
Lib::Map<unsigned_int,_unsigned_int,_Lib::DefaultHash>::Iterator::hasNext(Iterator *this)

{
  Entry *pEVar1;
  
  pEVar1 = this->_next;
  while ((pEVar1 != this->_last && (pEVar1->code == 0))) {
    pEVar1 = pEVar1 + 1;
    this->_next = pEVar1;
  }
  return pEVar1 != this->_last;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
        if (_next->occupied()) {
          return true;
        }
        _next++;
      }
      return false;
    }